

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O3

Error __thiscall asmjit::CodeBuilder::embed(CodeBuilder *this,void *data,uint32_t size)

{
  Error EVar1;
  CBData *node;
  
  EVar1 = (this->super_CodeEmitter)._lastError;
  if (EVar1 == 0) {
    node = newDataNode(this,data,size);
    if (node == (CBData *)0x0) {
      EVar1 = CodeEmitter::setLastError(&this->super_CodeEmitter,1,(char *)0x0);
      return EVar1;
    }
    addNode(this,&node->super_CBNode);
    EVar1 = 0;
  }
  return EVar1;
}

Assistant:

Error CodeBuilder::embed(const void* data, uint32_t size) {
  if (_lastError) return _lastError;

  CBData* node = newDataNode(data, size);
  if (ASMJIT_UNLIKELY(!node))
    return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

  addNode(node);
  return kErrorOk;
}